

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-utils.h
# Opt level: O2

void wasm::OptUtils::addUsefulPassesAfterInlining(PassRunner *runner)

{
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  string local_40;
  allocator<char> local_19;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"precompute-propagate",&local_19);
  local_68._M_engaged = false;
  PassRunner::add(runner,&local_40,
                  (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_68);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_68);
  std::__cxx11::string::~string((string *)&local_40);
  PassRunner::addDefaultFunctionOptimizationPasses(runner);
  return;
}

Assistant:

inline void addUsefulPassesAfterInlining(PassRunner& runner) {
  // Propagating constants makes a lot of sense after inlining, as new constants
  // may have arrived.
  runner.add("precompute-propagate");
  // Do all the usual stuff.
  runner.addDefaultFunctionOptimizationPasses();
}